

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher.cpp
# Opt level: O3

void __thiscall cppnet::Dispatcher::StopTimer(Dispatcher *this,uint32_t timer_id)

{
  int *piVar1;
  long lVar2;
  element_type *peVar3;
  int iVar4;
  pthread_t pVar5;
  iterator __it;
  long *in_FS_OFFSET;
  long local_50;
  long *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  pVar5 = pthread_self();
  if (pVar5 == (this->_local_thread_id)._M_thread) {
    __all_timer_event_map::__tls_init();
    lVar2 = *in_FS_OFFSET;
    local_40._M_unused._M_object = (void *)(ulong)timer_id;
    __it = std::
           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(lVar2 + -0xc0),(key_type *)local_40._M_pod_data);
    __all_timer_event_map::__tls_init();
    if (__it.
        super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      peVar3 = (this->_timer).super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_50 = *(long *)((long)__it.
                                 super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
                                 ._M_cur + 0x10) + 0x28;
      if (*(long *)((long)__it.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
                          ._M_cur + 0x10) == 0) {
        local_50 = 0;
      }
      local_48 = *(long **)((long)__it.
                                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
                                  ._M_cur + 0x18);
      if (local_48 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)((long)local_48 + 0xc) = *(int *)((long)local_48 + 0xc) + 1;
          UNLOCK();
        }
        else {
          *(int *)((long)local_48 + 0xc) = *(int *)((long)local_48 + 0xc) + 1;
        }
      }
      (*peVar3->_vptr_Timer[1])(peVar3,&local_50);
      if (local_48 != (long *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          piVar1 = (int *)((long)local_48 + 0xc);
          iVar4 = *piVar1;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
        }
        else {
          iVar4 = *(int *)((long)local_48 + 0xc);
          *(int *)((long)local_48 + 0xc) = iVar4 + -1;
        }
        if (iVar4 == 1) {
          (**(code **)(*local_48 + 0x18))();
        }
      }
      __all_timer_event_map::__tls_init();
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               *)(lVar2 + -0xc0),
              (const_iterator)
              __it.
              super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::TimerEvent>_>,_false>
              ._M_cur);
    }
  }
  else {
    local_40._4_4_ = 0;
    local_40._0_4_ = timer_id;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
               ::_M_invoke;
    local_30 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/dispatcher.cpp:186:21)>
               ::_M_manager;
    local_40._8_8_ = this;
    PostTask(this,(Task *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
  }
  return;
}

Assistant:

void Dispatcher::StopTimer(uint32_t timer_id) {
    if (std::this_thread::get_id() == _local_thread_id) {
        auto iter = __all_timer_event_map.find(timer_id);
        if (iter == __all_timer_event_map.end()) {
            return;
        }
        
        _timer->RmTimer(iter->second);
        __all_timer_event_map.erase(iter);

    } else {
        auto task = [timer_id, this]() {
            auto iter = __all_timer_event_map.find(timer_id);
            if (iter == __all_timer_event_map.end()) {
                return;
            }

            _timer->RmTimer(iter->second);
            __all_timer_event_map.erase(iter);
        };
        PostTask(task);
    }
}